

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op<std::minus<float>>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  float fVar4;
  int i_10;
  int i_9;
  float b0_5;
  int x_3;
  float a0_5;
  int y_3;
  float *outptr_8;
  float *ptr1_5;
  int i_8;
  float *outptr_7;
  float *ptr1_4;
  float a0_4;
  int q_6;
  int i_7;
  float a0_3;
  int i_6;
  float a0_2;
  int i_5;
  float *outptr_6;
  float *ptr1_3;
  int q_5;
  float a0_1;
  int x_2;
  float b0_4;
  int y_2;
  float *outptr_5;
  float *ptr_5;
  int i_4;
  float b0_3;
  int i_3;
  int x_1;
  float a0;
  int y_1;
  float *outptr_4;
  float *ptr1_2;
  float *ptr_4;
  int q_4;
  int i_2;
  float *outptr_3;
  float b0_2;
  float *ptr_3;
  int q_3;
  int i_1;
  float *outptr_2;
  float *ptr_2;
  int q_2;
  float b0_1;
  int x;
  float b0;
  int y;
  float *outptr_1;
  float *ptr1_1;
  float *ptr_1;
  int q_1;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  int size1;
  int channels1;
  int h1;
  int w1;
  size_t elemsize;
  int size;
  int channels;
  int h;
  int w;
  minus<float> op;
  Mat *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  size_t in_stack_fffffffffffffa70;
  int _c;
  int _h;
  undefined8 in_stack_fffffffffffffa78;
  int _w;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  int local_4f8;
  int local_4f4;
  float local_4f0;
  int local_4ec;
  float local_4e8;
  int local_4e4;
  float *local_4e0;
  float *local_4d8;
  int local_4cc;
  Mat local_4c8;
  float *local_490;
  Mat local_488;
  float *local_450;
  float local_444;
  int local_440;
  int local_43c;
  float local_438;
  int local_434;
  float local_430;
  int local_42c;
  Mat local_428;
  float *local_3f0;
  Mat local_3e8;
  float *local_3b0;
  int local_3a4;
  float local_3a0;
  int local_39c;
  float local_398;
  int local_394;
  float *local_390;
  float *local_388;
  int local_380;
  float local_37c;
  int local_378;
  int local_374;
  float local_370;
  int local_36c;
  Mat local_368;
  float *local_330;
  Mat local_328;
  float *local_2f0;
  float *local_2e8;
  int local_2e0;
  int local_2dc;
  Mat local_2d8;
  float *local_2a0;
  float local_294;
  Mat local_290;
  float *local_258;
  int local_250;
  int local_24c;
  Mat local_248;
  float *local_210;
  Mat local_208;
  float *local_1d0;
  int local_1c4;
  float local_1c0;
  int local_1bc;
  float local_1b8;
  int local_1b4;
  Mat local_1b0;
  float *local_178;
  float *local_170;
  Mat local_168;
  float *local_130;
  int local_128;
  int local_124;
  Mat local_120;
  float *local_e8;
  Mat local_e0;
  float *local_a8;
  Mat local_a0;
  float *local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  size_t local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  minus<float> local_29 [9];
  Mat *local_20;
  Mat *local_18;
  Mat *local_10;
  
  local_30 = in_RDI->w;
  local_34 = in_RDI->h;
  local_38 = in_RDI->c;
  local_3c = local_30 * local_34;
  local_48 = in_RDI->elemsize;
  local_4c = in_RSI->w;
  local_50 = in_RSI->h;
  local_54 = in_RSI->c;
  local_58 = local_4c * local_50;
  _c = (int)(in_stack_fffffffffffffa70 >> 0x20);
  _h = (int)in_stack_fffffffffffffa78;
  _w = (int)((ulong)in_stack_fffffffffffffa78 >> 0x20);
  local_18 = in_RSI;
  if (in_RDI->dims == 3) {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),_w,_h,_c,
                CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                (Allocator *)in_stack_fffffffffffffa60);
    bVar1 = Mat::empty(in_stack_fffffffffffffa60);
    if (bVar1) {
      return -100;
    }
    if (local_18->dims == 3) {
      for (local_5c = 0; local_5c < local_38; local_5c = local_5c + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                     (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_a0);
        Mat::~Mat((Mat *)0x13636d);
        local_68 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                     (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_e0);
        Mat::~Mat((Mat *)0x1363bb);
        local_a8 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                     (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_120);
        Mat::~Mat((Mat *)0x136409);
        local_e8 = pfVar2;
        for (local_124 = 0; local_124 < local_3c; local_124 = local_124 + 1) {
          fVar4 = std::minus<float>::operator()(local_29,local_68 + local_124,local_a8 + local_124);
          local_e8[local_124] = fVar4;
        }
      }
      return 0;
    }
    if (local_18->dims == 2) {
      for (local_128 = 0; local_128 < local_38; local_128 = local_128 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                     (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_168);
        Mat::~Mat((Mat *)0x13652e);
        local_130 = pfVar2;
        local_170 = Mat::operator_cast_to_float_(local_18);
        local_170 = local_170 + local_34 * local_128;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                     (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_1b0);
        Mat::~Mat((Mat *)0x1365aa);
        local_178 = pfVar2;
        for (local_1b4 = 0; local_1b4 < local_34; local_1b4 = local_1b4 + 1) {
          local_1b8 = local_170[local_1b4];
          for (local_1bc = 0; local_1bc < local_30; local_1bc = local_1bc + 1) {
            fVar4 = std::minus<float>::operator()(local_29,local_130 + local_1bc,&local_1b8);
            local_178[local_1bc] = fVar4;
          }
          local_130 = local_130 + local_30;
          local_178 = local_178 + local_30;
        }
      }
      return 0;
    }
    if (local_18->dims == 1) {
      if (local_18->w == 1) {
        pfVar2 = Mat::operator[](local_18,0);
        local_1c0 = *pfVar2;
        for (local_1c4 = 0; local_1c4 < local_38; local_1c4 = local_1c4 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                       (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_208);
          Mat::~Mat((Mat *)0x136780);
          local_1d0 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                       (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_248);
          Mat::~Mat((Mat *)0x1367cb);
          local_210 = pfVar2;
          for (local_24c = 0; local_24c < local_3c; local_24c = local_24c + 1) {
            fVar4 = std::minus<float>::operator()(local_29,local_1d0 + local_24c,&local_1c0);
            local_210[local_24c] = fVar4;
          }
        }
        return 0;
      }
      for (local_250 = 0; local_250 < local_38; local_250 = local_250 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                     (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_290);
        Mat::~Mat((Mat *)0x1368cc);
        local_258 = pfVar2;
        pfVar2 = Mat::operator[](local_18,local_250);
        local_294 = *pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                     (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_2d8);
        Mat::~Mat((Mat *)0x136935);
        local_2a0 = pfVar2;
        for (local_2dc = 0; local_2dc < local_3c; local_2dc = local_2dc + 1) {
          fVar4 = std::minus<float>::operator()(local_29,local_258 + local_2dc,&local_294);
          local_2a0[local_2dc] = fVar4;
        }
      }
      return 0;
    }
  }
  else {
    local_20 = in_RDX;
    local_10 = in_RDI;
    if (in_RDI->dims == 2) {
      if (in_RSI->dims == 3) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                    (Allocator *)in_stack_fffffffffffffa60);
        bVar1 = Mat::empty(in_stack_fffffffffffffa60);
        if (!bVar1) {
          for (local_2e0 = 0; local_2e0 < local_54; local_2e0 = local_2e0 + 1) {
            local_2e8 = Mat::operator_cast_to_float_(local_10);
            local_2e8 = local_2e8 + local_50 * local_2e0;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                         (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_328);
            Mat::~Mat((Mat *)0x136ae3);
            local_2f0 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                         (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_368);
            Mat::~Mat((Mat *)0x136b2b);
            local_330 = pfVar2;
            for (local_36c = 0; local_36c < local_50; local_36c = local_36c + 1) {
              local_370 = local_2e8[local_36c];
              for (local_374 = 0; local_374 < local_4c; local_374 = local_374 + 1) {
                fVar4 = std::minus<float>::operator()(local_29,&local_370,local_2f0 + local_374);
                local_330[local_374] = fVar4;
              }
              local_2f0 = local_2f0 + local_4c;
              local_330 = local_330 + local_4c;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),_w,_h,
                  in_stack_fffffffffffffa70,
                  (Allocator *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      bVar1 = Mat::empty(in_stack_fffffffffffffa60);
      if (bVar1) {
        return -100;
      }
      if (local_18->dims == 2) {
        for (local_378 = 0; local_378 < local_3c; local_378 = local_378 + 1) {
          pfVar2 = Mat::operator[](local_10,local_378);
          pfVar3 = Mat::operator[](local_18,local_378);
          fVar4 = std::minus<float>::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,local_378);
          *pfVar2 = fVar4;
        }
        return 0;
      }
      if (local_18->dims == 1) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                    (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),(int)in_stack_fffffffffffffa78,
                    in_stack_fffffffffffffa70,
                    (Allocator *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        bVar1 = Mat::empty(in_stack_fffffffffffffa60);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_37c = *pfVar2;
          for (local_380 = 0; local_380 < local_3c; local_380 = local_380 + 1) {
            pfVar2 = Mat::operator[](local_10,local_380);
            fVar4 = std::minus<float>::operator()(local_29,pfVar2,&local_37c);
            pfVar2 = Mat::operator[](local_20,local_380);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        local_388 = Mat::operator_cast_to_float_(local_10);
        local_390 = Mat::operator_cast_to_float_(local_20);
        for (local_394 = 0; local_394 < local_34; local_394 = local_394 + 1) {
          pfVar2 = Mat::operator[](local_18,local_394);
          local_398 = *pfVar2;
          for (local_39c = 0; local_39c < local_30; local_39c = local_39c + 1) {
            fVar4 = std::minus<float>::operator()(local_29,local_388 + local_39c,&local_398);
            local_390[local_39c] = fVar4;
          }
          local_388 = local_388 + local_30;
          local_390 = local_390 + local_30;
        }
        return 0;
      }
    }
    else if (in_RDI->dims == 1) {
      if (in_RDI->w == 1) {
        if (in_RSI->dims == 3) {
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),_w,_h,_c,
                      CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                      (Allocator *)in_stack_fffffffffffffa60);
          bVar1 = Mat::empty(in_stack_fffffffffffffa60);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_3a0 = *pfVar2;
            for (local_3a4 = 0; local_3a4 < local_54; local_3a4 = local_3a4 + 1) {
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                           (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_3e8);
              Mat::~Mat((Mat *)0x1370da);
              local_3b0 = pfVar2;
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                           (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_428);
              Mat::~Mat((Mat *)0x137122);
              local_3f0 = pfVar2;
              for (local_42c = 0; local_42c < local_58; local_42c = local_42c + 1) {
                fVar4 = std::minus<float>::operator()(local_29,&local_3a0,local_3b0 + local_42c);
                local_3f0[local_42c] = fVar4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 2) {
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),_w,_h,
                      in_stack_fffffffffffffa70,
                      (Allocator *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
          bVar1 = Mat::empty(in_stack_fffffffffffffa60);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_430 = *pfVar2;
            for (local_434 = 0; local_434 < local_58; local_434 = local_434 + 1) {
              pfVar2 = Mat::operator[](local_18,local_434);
              fVar4 = std::minus<float>::operator()(local_29,&local_430,pfVar2);
              pfVar2 = Mat::operator[](local_20,local_434);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 1) {
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),_w,
                      in_stack_fffffffffffffa70,
                      (Allocator *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
          bVar1 = Mat::empty(in_stack_fffffffffffffa60);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_438 = *pfVar2;
            for (local_43c = 0; local_43c < local_58; local_43c = local_43c + 1) {
              pfVar2 = Mat::operator[](local_18,local_43c);
              fVar4 = std::minus<float>::operator()(local_29,&local_438,pfVar2);
              pfVar2 = Mat::operator[](local_20,local_43c);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
      }
      if (in_RSI->dims == 3) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                    (Allocator *)in_stack_fffffffffffffa60);
        bVar1 = Mat::empty(in_stack_fffffffffffffa60);
        if (!bVar1) {
          for (local_440 = 0; local_440 < local_54; local_440 = local_440 + 1) {
            pfVar2 = Mat::operator[](local_10,local_440);
            local_444 = *pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                         (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_488);
            Mat::~Mat((Mat *)0x1374c3);
            local_450 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                         (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_4c8);
            Mat::~Mat((Mat *)0x13750b);
            local_490 = pfVar2;
            for (local_4cc = 0; local_4cc < local_58; local_4cc = local_4cc + 1) {
              fVar4 = std::minus<float>::operator()(local_29,&local_444,local_450 + local_4cc);
              local_490[local_4cc] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 2) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),_w,_h,
                    in_stack_fffffffffffffa70,
                    (Allocator *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        bVar1 = Mat::empty(in_stack_fffffffffffffa60);
        if (!bVar1) {
          local_4d8 = Mat::operator_cast_to_float_(local_18);
          local_4e0 = Mat::operator_cast_to_float_(local_20);
          for (local_4e4 = 0; local_4e4 < local_50; local_4e4 = local_4e4 + 1) {
            pfVar2 = Mat::operator[](local_10,local_4e4);
            local_4e8 = *pfVar2;
            for (local_4ec = 0; local_4ec < local_4c; local_4ec = local_4ec + 1) {
              fVar4 = std::minus<float>::operator()(local_29,&local_4e8,local_4d8 + local_4ec);
              local_4e0[local_4ec] = fVar4;
            }
            local_4d8 = local_4d8 + local_4c;
            local_4e0 = local_4e0 + local_4c;
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 1) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),_w,
                    in_stack_fffffffffffffa70,
                    (Allocator *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        bVar1 = Mat::empty(in_stack_fffffffffffffa60);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_4f0 = *pfVar2;
          for (local_4f4 = 0; local_4f4 < local_3c; local_4f4 = local_4f4 + 1) {
            pfVar2 = Mat::operator[](local_10,local_4f4);
            fVar4 = std::minus<float>::operator()(local_29,pfVar2,&local_4f0);
            pfVar2 = Mat::operator[](local_20,local_4f4);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        for (local_4f8 = 0; local_4f8 < local_3c; local_4f8 = local_4f8 + 1) {
          pfVar2 = Mat::operator[](local_10,local_4f8);
          pfVar3 = Mat::operator[](local_18,local_4f8);
          fVar4 = std::minus<float>::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,local_4f8);
          *pfVar2 = fVar4;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;
    size_t elemsize = a.elemsize;

    int w1 = b.w;
    int h1 = b.h;
    int channels1 = b.c;
    int size1 = w1 * h1;

    if (a.dims == 3)
    {
        c.create(w, h, channels, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = (const float*)b + h * q;
                float* outptr = c.channel(q);

                for (int y=0; y<h; y++)
                {
                    const float b0 = ptr1[y];
                    for (int x=0; x<w; x++)
                    {
                        outptr[x] = op(ptr[x], b0);
                    }

                    ptr += w;
                    outptr += w;
                }
            }

            return 0;
        }

        if (b.dims == 1)
        {
            if (b.w == 1)
            {
                const float b0 = b[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = a.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] = op(ptr[i], b0);
                    }
                }

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float b0 = b[q];
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], b0);
                }
            }

            return 0;
        }
    }
    else if (a.dims == 2)
    {
        if (b.dims == 3)
        {
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels1; q++)
            {
                const float* ptr = (const float*)a + h1 * q;
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int y=0; y<h1; y++)
                {
                    const float a0 = ptr[y];
                    for (int x=0; x<w1; x++)
                    {
                        outptr[x] = op(a0, ptr1[x]);
                    }

                    ptr1 += w1;
                    outptr += w1;
                }
            }

            return 0;
        }

        c.create(w, h, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 2)
        {
            for (int i=0; i<size; i++)
            {
                c[i] = op(a[i], b[i]);
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, h, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                const float b0 = b[0];
                for (int i=0; i<size; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            const float* ptr = a;
            float* outptr = c;

            for (int y=0; y<h; y++)
            {
                const float b0 = b[y];
                for (int x=0; x<w; x++)
                {
                    outptr[x] = op(ptr[x], b0);
                }

                ptr += w;
                outptr += w;
            }

            return 0;
        }
    }
    else if (a.dims == 1)
    {
        if (a.w == 1)
        {
            if (b.dims == 3)
            {
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels1; q++)
                {
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size1; i++)
                    {
                        outptr[i] = op(a0, ptr1[i]);
                    }
                }

                return 0;
            }

            if (b.dims == 2)
            {
                c.create(w1, h1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<size1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }

            if (b.dims == 1)
            {
                c.create(w1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<size1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }
        }

        if (b.dims == 3)
        {
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels1; q++)
            {
                const float a0 = a[q];
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size1; i++)
                {
                    outptr[i] = op(a0, ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            c.create(w1, h1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            const float* ptr1 = b;
            float* outptr = c;

            for (int y=0; y<h1; y++)
            {
                const float a0 = a[y];
                for (int x=0; x<w1; x++)
                {
                    outptr[x] = op(a0, ptr1[x]);
                }

                ptr1 += w1;
                outptr += w1;
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                const float b0 = b[0];
                for (int i=0; i<size; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            for (int i=0; i<size; i++)
            {
                c[i] = op(a[i], b[i]);
            }
        }
    }

    return 0;
}